

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O0

void linreg_clrm(double *x,double *y,int N,double *b,double *var,double *res,double alpha,
                double *anv,double *ci_lower,double *ci_upper)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  double dVar2;
  double dVar3;
  double p;
  double dVar4;
  double chi1a2;
  double chia2;
  double intrvl;
  double ta2;
  double a2;
  double seb2;
  double seb1;
  double den3;
  double den2;
  double sum;
  double den;
  double num;
  double ym;
  double xm;
  double *yi;
  double *xi;
  int df;
  int i;
  double alpha_local;
  double *res_local;
  double *var_local;
  double *b_local;
  int N_local;
  double *y_local;
  double *x_local;
  
  __ptr = malloc((long)N << 3);
  __ptr_00 = malloc((long)N << 3);
  dVar2 = mean(x,N);
  dVar3 = mean(y,N);
  den = 0.0;
  sum = 0.0;
  den3 = 0.0;
  seb1 = 0.0;
  den2 = 0.0;
  for (xi._4_4_ = 0; xi._4_4_ < N; xi._4_4_ = xi._4_4_ + 1) {
    *(double *)((long)__ptr + (long)xi._4_4_ * 8) = x[xi._4_4_] - dVar2;
    *(double *)((long)__ptr_00 + (long)xi._4_4_ * 8) = y[xi._4_4_] - dVar3;
    den = *(double *)((long)__ptr + (long)xi._4_4_ * 8) *
          *(double *)((long)__ptr_00 + (long)xi._4_4_ * 8) + den;
    sum = *(double *)((long)__ptr + (long)xi._4_4_ * 8) *
          *(double *)((long)__ptr + (long)xi._4_4_ * 8) + sum;
    den3 = x[xi._4_4_] * x[xi._4_4_] + den3;
    seb1 = *(double *)((long)__ptr_00 + (long)xi._4_4_ * 8) *
           *(double *)((long)__ptr_00 + (long)xi._4_4_ * 8) + seb1;
  }
  b[1] = den / sum;
  *b = -b[1] * dVar2 + dVar3;
  for (xi._4_4_ = 0; xi._4_4_ < N; xi._4_4_ = xi._4_4_ + 1) {
    res[xi._4_4_] = -b[1] * x[xi._4_4_] + (y[xi._4_4_] - *b);
    den2 = res[xi._4_4_] * res[xi._4_4_] + den2;
  }
  *var = den2 / (double)(N + -2);
  var[1] = (den3 * *var) / ((double)N * sum);
  var[2] = *var / sum;
  var[3] = -dVar2 * var[2];
  var[4] = (b[1] * b[1] * sum) / seb1;
  dVar2 = sqrt(var[1]);
  dVar3 = sqrt(var[2]);
  p = alpha / 2.0;
  iVar1 = N + -2;
  dVar4 = tinv(p,iVar1);
  *ci_lower = *b - dVar4 * dVar2;
  *ci_upper = *b + dVar4 * dVar2;
  ci_lower[1] = b[1] - dVar4 * dVar3;
  ci_upper[1] = b[1] + dVar4 * dVar3;
  dVar2 = chiinv(p,iVar1);
  dVar3 = chiinv(1.0 - p,iVar1);
  ci_lower[2] = ((double)iVar1 * *var) / dVar3;
  ci_upper[2] = ((double)iVar1 * *var) / dVar2;
  iVar1 = N + -2;
  *anv = seb1;
  anv[2] = *var * (double)iVar1;
  anv[1] = seb1 - anv[2];
  anv[3] = 1.0;
  anv[4] = (double)iVar1;
  anv[5] = (anv[1] / anv[3]) / (anv[2] / anv[4]);
  printf("%lf \n",*var);
  dVar2 = fcdf(anv[5],1,iVar1);
  anv[6] = 1.0 - dVar2;
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void linreg_clrm(double *x, double *y, int N, double* b,
	double *var, double *res, double alpha, double *anv,
	double* ci_lower, double* ci_upper) {
	int i, df;
	double *xi;
	double *yi;
	double xm, ym, num, den, sum, den2, den3;
	double seb1, seb2, a2, ta2, intrvl, chia2, chi1a2;

	/*
	* Classic Linear Regression Model
	*
	* x,y and res are all of same length - N
	*
	* alpha is used to determine confidence interval limits
	* for a given 100*(1-alpha) % confidence interval
	*
	*
	* Alpha takes values between  0 and 1.
	*
	* For 95% confidence interval, the value of alpha is 0.05
	* For 90% confidence interval, the value of alpha is 0.10 etc.
	*/

	/*
	* Parameters
	* b[0] - beta1
	* b[1] - beta2
	*/

	/*
	* var[0] - variance of residuals
	* var[1] variance beta1
	* var[2] variance beta2
	* var[3] covariance beta1,beta2
	* var[4] r^2 Goodness of Fit
	*/

	/*
	* ANOVA
	*
	* anv[0] - TSS Total Sum Of Squares
	* anv[1] - ESS Explained Sum Of Squares
	* anv[2] - RSS Residual Sum Of Squares
	* anv[3] - degrees of freedom of ESS
	* anv[4] - degrees of freedom of RSS
	* anv[5] - F Statistics = (anv[1] / anv[3]) / (anv[2] / anv[4])
	* anv[6] - P value associated with anv[5] used to reject/accept
	* zero hypothesis
	*/

	xi = (double*)malloc(sizeof(double) * N);
	yi = (double*)malloc(sizeof(double) * N);

	xm = mean(x, N);
	ym = mean(y, N);
	num = 0.0;
	den = 0.0;
	den2 = 0.0;
	den3 = 0.0;
	sum = 0.0;

	for (i = 0; i < N; ++i) {
		xi[i] = x[i] - xm;
		yi[i] = y[i] - ym;
		num += xi[i] * yi[i];
		den += xi[i] * xi[i];
		den2 += x[i] * x[i];
		den3 += yi[i] * yi[i];
	}

	b[1] = num / den;
	b[0] = ym - b[1] * xm;
	num = 0.0;

	for (i = 0; i < N; ++i) {
		res[i] = y[i] - b[0] - b[1] * x[i];
		sum += res[i] * res[i];
	}


	var[0] = sum / (N - 2);
	var[1] = den2 * var[0] / (N * den);
	var[2] = var[0] / den;
	var[3] = -xm * var[2];
	var[4] = b[1] * b[1] * den / den3;
	//Confidence Interval Estimations for a given alpha value

	// Find standard errors seb1 and seb2 from variances

	seb1 = sqrt(var[1]);
	seb2 = sqrt(var[2]);

	a2 = alpha / 2.;
	df = N - 2; // Number of parameters = 2

	ta2 = tinv(a2, df);
	intrvl = ta2 * seb1;

	ci_lower[0] = b[0] - intrvl;
	ci_upper[0] = b[0] + intrvl;

	intrvl = ta2 * seb2;

	ci_lower[1] = b[1] - intrvl;
	ci_upper[1] = b[1] + intrvl;

	// confidence interval for sigma^2

	chia2 = chiinv(a2, df);
	chi1a2 = chiinv(1. - a2, df);

	ci_lower[2] = (double)df * var[0] / chi1a2;
	ci_upper[2] = (double)df * var[0] / chia2;

	// ANOVA

	df = N - 2;
	anv[0] = den3;
	anv[2] = var[0] * (double)df;
	anv[1] = den3 - anv[2];
	anv[3] = 1;
	anv[4] = (double)df;
	anv[5] = (anv[1] / anv[3]) / (anv[2] / anv[4]);
	printf("%lf \n", var[0]);
	anv[6] = 1.0 - fcdf(anv[5], 1, df);

	free(xi);
	free(yi);
}